

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O2

int x509_name_ex_i2d(ASN1_VALUE **val,uchar **out,ASN1_ITEM *it)

{
  X509_NAME *a;
  uint uVar1;
  int iVar2;
  OPENSSL_STACK *sk;
  size_t sVar3;
  void *p_00;
  OPENSSL_STACK *sk_00;
  undefined4 extraout_var;
  ulong uVar4;
  OPENSSL_STACK *local_40;
  uchar *p;
  
  a = (X509_NAME *)*val;
  if (a->modified == 0) {
LAB_0019422b:
    uVar4 = a->bytes->length;
    iVar2 = (int)uVar4;
    if (out != (uchar **)0x0) {
      if ((uVar4 & 0xffffffff) != 0) {
        memcpy(*out,a->bytes->data,(long)iVar2);
      }
      *out = *out + iVar2;
    }
  }
  else {
    sk = OPENSSL_sk_new_null();
    if (sk != (OPENSSL_STACK *)0x0) {
      iVar2 = -1;
      sk_00 = (OPENSSL_STACK *)0x0;
      uVar4 = 0;
      do {
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
        if (sVar3 <= uVar4) {
          local_40 = sk;
          uVar1 = ASN1_item_ex_i2d((ASN1_VALUE **)&local_40,(uchar **)0x0,
                                   (ASN1_ITEM *)&X509_NAME_INTERNAL_it,-1,0);
          if ((0 < (int)uVar1) &&
             (iVar2 = BUF_MEM_grow((BUF_MEM *)a->bytes,(ulong)uVar1),
             CONCAT44(extraout_var,iVar2) != 0)) {
            p = (uchar *)a->bytes->data;
            iVar2 = ASN1_item_ex_i2d((ASN1_VALUE **)&local_40,&p,(ASN1_ITEM *)&X509_NAME_INTERNAL_it
                                     ,-1,0);
            if (0 < iVar2) {
              sk_STACK_OF_X509_NAME_ENTRY_pop_free
                        ((stack_st_STACK_OF_X509_NAME_ENTRY *)sk,local_sk_X509_NAME_ENTRY_free);
              a->modified = 0;
              iVar2 = x509_name_canon(a);
              if (iVar2 == 0) {
                return -1;
              }
              goto LAB_0019422b;
            }
          }
          break;
        }
        p_00 = OPENSSL_sk_value((OPENSSL_STACK *)a->entries,uVar4);
        if (*(int *)((long)p_00 + 0x10) != iVar2) {
          sk_00 = OPENSSL_sk_new_null();
          if (sk_00 == (OPENSSL_STACK *)0x0) break;
          sVar3 = OPENSSL_sk_push(sk,sk_00);
          if (sVar3 == 0) {
            OPENSSL_sk_free(sk_00);
            break;
          }
          iVar2 = *(int *)((long)p_00 + 0x10);
        }
        sVar3 = OPENSSL_sk_push(sk_00,p_00);
        uVar4 = uVar4 + 1;
      } while (sVar3 != 0);
    }
    sk_STACK_OF_X509_NAME_ENTRY_pop_free
              ((stack_st_STACK_OF_X509_NAME_ENTRY *)sk,local_sk_X509_NAME_ENTRY_free);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int x509_name_ex_i2d(ASN1_VALUE **val, unsigned char **out,
                            const ASN1_ITEM *it) {
  X509_NAME *a = (X509_NAME *)*val;
  if (a->modified && (!x509_name_encode(a) || !x509_name_canon(a))) {
    return -1;
  }
  int ret = a->bytes->length;
  if (out != NULL) {
    OPENSSL_memcpy(*out, a->bytes->data, ret);
    *out += ret;
  }
  return ret;
}